

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void main_parse_loop(vw *all)

{
  dispatch_fptr *in_stack_000000a8;
  vw *in_stack_000000b0;
  _func_void_vw_ptr_v_array<example_ptr> *in_stack_ffffffffffffffc8;
  function<void_(vw_&,_v_array<example_*>_&)> *in_stack_ffffffffffffffd0;
  
  std::function<void(vw&,v_array<example*>&)>::function<void(&)(vw&,v_array<example*>),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  parse_dispatch(in_stack_000000b0,in_stack_000000a8);
  std::function<void_(vw_&,_v_array<example_*>_&)>::~function
            ((function<void_(vw_&,_v_array<example_*>_&)> *)0x26bfb2);
  return;
}

Assistant:

void main_parse_loop(vw* all) { parse_dispatch(*all, thread_dispatch); }